

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O3

_Bool mainchan_rcvd_exit_signal(Channel *chan,ptrlen signame,_Bool core_dumped,ptrlen msg)

{
  uint uVar1;
  char *sigdesc;
  
  if (chan->vt == &mainchan_channelvt) {
    ssh_got_exitcode(*(Ssh **)(*(long *)&chan[-4].initial_fixed_window_size + 0x58),0x80);
    uVar1 = string_length_for_printf(signame.len);
    sigdesc = dupprintf("unrecognised signal \"%.*s\"",(ulong)uVar1,signame.ptr);
    mainchan_log_exit_signal_common
              (*(mainchan **)(*(long *)&chan[-4].initial_fixed_window_size + 0x40),sigdesc,
               core_dumped,msg);
    safefree(sigdesc);
    return true;
  }
  __assert_fail("chan->vt == &mainchan_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c",
                0x1a5,"_Bool mainchan_rcvd_exit_signal(Channel *, ptrlen, _Bool, ptrlen)");
}

Assistant:

static bool mainchan_rcvd_exit_signal(
    Channel *chan, ptrlen signame, bool core_dumped, ptrlen msg)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    int exitcode;
    char *signame_str;

    /*
     * Translate the signal description back into a locally meaningful
     * number, or 128 if the string didn't match any we recognise.
     */
    exitcode = 128;

    #define SIGNAL_SUB(s) \
        if (ptrlen_eq_string(signame, #s))      \
            exitcode = 128 + SIG ## s;
    #define SIGNAL_MAIN(s, text) SIGNAL_SUB(s)
    #define SIGNALS_LOCAL_ONLY
    #include "signal-list.h"
    #undef SIGNAL_SUB
    #undef SIGNAL_MAIN
    #undef SIGNALS_LOCAL_ONLY

    ssh_got_exitcode(mc->ppl->ssh, exitcode);
    if (exitcode == 128)
        signame_str = dupprintf("unrecognised signal \"%.*s\"",
                                PTRLEN_PRINTF(signame));
    else
        signame_str = dupprintf("signal SIG%.*s", PTRLEN_PRINTF(signame));
    mainchan_log_exit_signal_common(mc, signame_str, core_dumped, msg);
    sfree(signame_str);
    return true;
}